

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_decode.c
# Opt level: O2

cram_block_slice_hdr * cram_decode_slice_header(cram_fd *fd,cram_block *b)

{
  byte bVar1;
  cram_content_type cVar2;
  long lVar3;
  int iVar4;
  cram_block_slice_hdr *__ptr;
  int32_t *piVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  byte *pbVar11;
  ulong uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  long lStack_40;
  
  cVar2 = b->content_type;
  if ((cVar2 & ~COMPRESSION_HEADER) != MAPPED_SLICE) {
    return (cram_block_slice_hdr *)0x0;
  }
  pbVar11 = b->data;
  __ptr = (cram_block_slice_hdr *)calloc(1,0x48);
  if (__ptr == (cram_block_slice_hdr *)0x0) {
    return (cram_block_slice_hdr *)0x0;
  }
  __ptr->content_type = cVar2;
  if (cVar2 == MAPPED_SLICE) {
    bVar1 = *pbVar11;
    uVar6 = (uint)bVar1;
    lVar8 = 1;
    lVar10 = lVar8;
    if ((char)bVar1 < '\0') {
      uVar7 = (uint)bVar1;
      uVar6 = (uint)pbVar11[1];
      if (bVar1 < 0xc0) {
        uVar6 = (uVar7 & 0x3f) << 8 | uVar6;
        lStack_40 = 2;
        lVar10 = lStack_40;
      }
      else if (bVar1 < 0xe0) {
        uVar6 = (uVar7 & 0x1f) << 0x10 | uVar6 << 8 | (uint)pbVar11[2];
        lStack_40 = 3;
        lVar10 = lStack_40;
      }
      else if (bVar1 < 0xf0) {
        uVar6 = (uVar7 & 0xf) << 0x18 | uVar6 << 0x10 | (uint)pbVar11[2] << 8 | (uint)pbVar11[3];
        lStack_40 = 4;
        lVar10 = lStack_40;
      }
      else {
        uVar6 = pbVar11[4] & 0xf |
                (uint)pbVar11[3] << 4 | (uint)pbVar11[2] << 0xc | uVar6 << 0x14 | uVar7 << 0x1c;
        lStack_40 = 5;
        lVar10 = lStack_40;
      }
    }
    __ptr->ref_seq_id = uVar6;
    bVar1 = pbVar11[lVar10];
    uVar6 = (uint)bVar1;
    lStack_40 = lVar8;
    if ((char)bVar1 < '\0') {
      uVar7 = (uint)bVar1;
      uVar6 = (uint)pbVar11[lVar10 + 1];
      if (bVar1 < 0xc0) {
        uVar6 = (uVar7 & 0x3f) << 8 | uVar6;
        lStack_40 = 2;
      }
      else if (bVar1 < 0xe0) {
        uVar6 = (uVar7 & 0x1f) << 0x10 | uVar6 << 8 | (uint)pbVar11[lVar10 + 2];
        lStack_40 = 3;
      }
      else if (bVar1 < 0xf0) {
        uVar6 = (uVar7 & 0xf) << 0x18 | uVar6 << 0x10 | (uint)pbVar11[lVar10 + 2] << 8 |
                (uint)pbVar11[lVar10 + 3];
        lStack_40 = 4;
      }
      else {
        uVar6 = pbVar11[lVar10 + 4] & 0xf |
                (uint)pbVar11[lVar10 + 3] << 4 |
                (uint)pbVar11[lVar10 + 2] << 0xc | uVar6 << 0x14 | uVar7 << 0x1c;
        lStack_40 = 5;
      }
    }
    __ptr->ref_seq_start = uVar6;
    lVar3 = lStack_40 + lVar10;
    bVar1 = pbVar11[lStack_40 + lVar10];
    uVar6 = (uint)bVar1;
    lStack_40 = lVar8;
    if ((char)bVar1 < '\0') {
      uVar7 = (uint)bVar1;
      uVar6 = (uint)pbVar11[lVar3 + 1];
      if (bVar1 < 0xc0) {
        uVar6 = (uVar7 & 0x3f) << 8 | uVar6;
        lStack_40 = 2;
      }
      else if (bVar1 < 0xe0) {
        uVar6 = (uVar7 & 0x1f) << 0x10 | uVar6 << 8 | (uint)pbVar11[lVar3 + 2];
        lStack_40 = 3;
      }
      else if (bVar1 < 0xf0) {
        uVar6 = (uVar7 & 0xf) << 0x18 | uVar6 << 0x10 | (uint)pbVar11[lVar3 + 2] << 8 |
                (uint)pbVar11[lVar3 + 3];
        lStack_40 = 4;
      }
      else {
        uVar6 = pbVar11[lVar3 + 4] & 0xf |
                (uint)pbVar11[lVar3 + 3] << 4 |
                (uint)pbVar11[lVar3 + 2] << 0xc | uVar6 << 0x14 | uVar7 << 0x1c;
        lStack_40 = 5;
      }
    }
    __ptr->ref_seq_span = uVar6;
    pbVar11 = pbVar11 + lStack_40 + lVar3;
  }
  bVar1 = *pbVar11;
  uVar6 = (uint)bVar1;
  lStack_40 = 1;
  if (-1 < (char)bVar1) goto LAB_00116391;
  uVar7 = (uint)pbVar11[1];
  uVar6 = (uint)bVar1;
  if (bVar1 < 0xc0) {
    lStack_40 = 2;
    uVar6 = (uVar6 & 0x3f) << 8;
  }
  else {
    if (bVar1 < 0xe0) {
      lStack_40 = 3;
      uVar6 = (uVar6 & 0x1f) << 0x10 | uVar7 << 8 | (uint)pbVar11[2];
      goto LAB_00116391;
    }
    if (bVar1 < 0xf0) {
      lStack_40 = 4;
      uVar6 = (uVar6 & 0xf) << 0x18 | uVar7 << 0x10 | (uint)pbVar11[2] << 8 | (uint)pbVar11[3];
      goto LAB_00116391;
    }
    lStack_40 = 5;
    uVar7 = (uint)pbVar11[3] << 4 | (uint)pbVar11[2] << 0xc | uVar7 << 0x14 | uVar6 << 0x1c;
    uVar6 = pbVar11[4] & 0xf;
  }
  uVar6 = uVar6 | uVar7;
LAB_00116391:
  __ptr->num_records = uVar6;
  pbVar11 = pbVar11 + lStack_40;
  iVar4 = fd->version >> 8;
  if (iVar4 == 2) {
    bVar1 = *pbVar11;
    uVar6 = (uint)bVar1;
    if ((char)bVar1 < '\0') {
      uVar7 = (uint)bVar1;
      uVar6 = (uint)pbVar11[1];
      if (bVar1 < 0xc0) {
        uVar6 = (uVar7 & 0x3f) << 8 | uVar6;
        lStack_40 = 2;
      }
      else if (bVar1 < 0xe0) {
        uVar6 = (uVar7 & 0x1f) << 0x10 | uVar6 << 8 | (uint)pbVar11[2];
        lStack_40 = 3;
      }
      else if (bVar1 < 0xf0) {
        uVar6 = (uVar7 & 0xf) << 0x18 | uVar6 << 0x10 | (uint)pbVar11[2] << 8 | (uint)pbVar11[3];
        lStack_40 = 4;
      }
      else {
        uVar6 = pbVar11[4] & 0xf |
                (uint)pbVar11[3] << 4 | (uint)pbVar11[2] << 0xc | uVar6 << 0x14 | uVar7 << 0x1c;
        lStack_40 = 5;
      }
    }
    else {
      lStack_40 = 1;
    }
    pbVar11 = pbVar11 + lStack_40;
    __ptr->record_counter = (long)(int)uVar6;
  }
  else if (2 < iVar4) {
    iVar4 = ltf8_get((char *)pbVar11,&__ptr->record_counter);
    pbVar11 = pbVar11 + iVar4;
  }
  bVar1 = *pbVar11;
  uVar6 = (uint)bVar1;
  lVar8 = 1;
  if ((char)bVar1 < '\0') {
    uVar7 = (uint)bVar1;
    uVar6 = (uint)pbVar11[1];
    if (bVar1 < 0xc0) {
      uVar6 = (uVar7 & 0x3f) << 8 | uVar6;
      lStack_40 = 2;
      lVar8 = lStack_40;
    }
    else if (bVar1 < 0xe0) {
      uVar6 = (uVar7 & 0x1f) << 0x10 | uVar6 << 8 | (uint)pbVar11[2];
      lStack_40 = 3;
      lVar8 = lStack_40;
    }
    else if (bVar1 < 0xf0) {
      uVar6 = (uVar7 & 0xf) << 0x18 | uVar6 << 0x10 | (uint)pbVar11[2] << 8 | (uint)pbVar11[3];
      lStack_40 = 4;
      lVar8 = lStack_40;
    }
    else {
      uVar6 = pbVar11[4] & 0xf |
              (uint)pbVar11[3] << 4 | (uint)pbVar11[2] << 0xc | uVar6 << 0x14 | uVar7 << 0x1c;
      lStack_40 = 5;
      lVar8 = lStack_40;
    }
  }
  __ptr->num_blocks = uVar6;
  bVar1 = pbVar11[lVar8];
  uVar6 = (uint)bVar1;
  lStack_40 = 1;
  if ((char)bVar1 < '\0') {
    uVar7 = (uint)bVar1;
    uVar6 = (uint)pbVar11[lVar8 + 1];
    if (bVar1 < 0xc0) {
      uVar6 = (uVar7 & 0x3f) << 8 | uVar6;
      lStack_40 = 2;
    }
    else if (bVar1 < 0xe0) {
      uVar6 = (uVar7 & 0x1f) << 0x10 | uVar6 << 8 | (uint)pbVar11[lVar8 + 2];
      lStack_40 = 3;
    }
    else if (bVar1 < 0xf0) {
      uVar6 = (uVar7 & 0xf) << 0x18 | uVar6 << 0x10 | (uint)pbVar11[lVar8 + 2] << 8 |
              (uint)pbVar11[lVar8 + 3];
      lStack_40 = 4;
    }
    else {
      uVar6 = pbVar11[lVar8 + 4] & 0xf |
              (uint)pbVar11[lVar8 + 3] << 4 |
              (uint)pbVar11[lVar8 + 2] << 0xc | uVar6 << 0x14 | uVar7 << 0x1c;
      lStack_40 = 5;
    }
  }
  __ptr->num_content_ids = uVar6;
  piVar5 = (int32_t *)malloc((long)(int)uVar6 << 2);
  __ptr->block_content_ids = piVar5;
  if (piVar5 == (int32_t *)0x0) {
    free(__ptr);
    return (cram_block_slice_hdr *)0x0;
  }
  pbVar11 = pbVar11 + lStack_40 + lVar8;
  uVar9 = 0;
  uVar12 = (ulong)uVar6;
  if ((int)uVar6 < 1) {
    uVar12 = uVar9;
  }
  for (; uVar12 != uVar9; uVar9 = uVar9 + 1) {
    bVar1 = *pbVar11;
    uVar6 = (uint)bVar1;
    lVar8 = 1;
    if ((char)bVar1 < '\0') {
      uVar7 = (uint)bVar1;
      uVar6 = (uint)pbVar11[1];
      if (bVar1 < 0xc0) {
        uVar6 = (uVar7 & 0x3f) << 8 | uVar6;
        lVar8 = 2;
      }
      else if (bVar1 < 0xe0) {
        uVar6 = (uVar7 & 0x1f) << 0x10 | uVar6 << 8 | (uint)pbVar11[2];
        lVar8 = 3;
      }
      else if (bVar1 < 0xf0) {
        uVar6 = (uVar7 & 0xf) << 0x18 | uVar6 << 0x10 | (uint)pbVar11[2] << 8 | (uint)pbVar11[3];
        lVar8 = 4;
      }
      else {
        uVar6 = pbVar11[4] & 0xf |
                (uint)pbVar11[3] << 4 | (uint)pbVar11[2] << 0xc | uVar6 << 0x14 | uVar7 << 0x1c;
        lVar8 = 5;
      }
    }
    piVar5[uVar9] = uVar6;
    pbVar11 = pbVar11 + lVar8;
  }
  if (b->content_type == MAPPED_SLICE) {
    bVar1 = *pbVar11;
    uVar6 = (uint)bVar1;
    if ((char)bVar1 < '\0') {
      uVar7 = (uint)bVar1;
      uVar6 = (uint)pbVar11[1];
      if (bVar1 < 0xc0) {
        uVar6 = (uVar7 & 0x3f) << 8 | uVar6;
        lStack_40 = 2;
      }
      else if (bVar1 < 0xe0) {
        uVar6 = (uVar7 & 0x1f) << 0x10 | uVar6 << 8 | (uint)pbVar11[2];
        lStack_40 = 3;
      }
      else if (bVar1 < 0xf0) {
        uVar6 = (uVar7 & 0xf) << 0x18 | uVar6 << 0x10 | (uint)pbVar11[2] << 8 | (uint)pbVar11[3];
        lStack_40 = 4;
      }
      else {
        uVar6 = pbVar11[4] & 0xf |
                (uint)pbVar11[3] << 4 | (uint)pbVar11[2] << 0xc | uVar6 << 0x14 | uVar7 << 0x1c;
        lStack_40 = 5;
      }
    }
    else {
      lStack_40 = 1;
    }
    __ptr->ref_base_id = uVar6;
    pbVar11 = pbVar11 + lStack_40;
  }
  if ((fd->version & 0xffffff00U) == 0x100) {
    uVar13 = 0;
    uVar14 = 0;
    uVar15 = 0;
    uVar16 = 0;
  }
  else {
    uVar13 = *(undefined4 *)pbVar11;
    uVar14 = *(undefined4 *)(pbVar11 + 4);
    uVar15 = *(undefined4 *)(pbVar11 + 8);
    uVar16 = *(undefined4 *)(pbVar11 + 0xc);
  }
  *(undefined4 *)__ptr->md5 = uVar13;
  *(undefined4 *)(__ptr->md5 + 4) = uVar14;
  *(undefined4 *)(__ptr->md5 + 8) = uVar15;
  *(undefined4 *)(__ptr->md5 + 0xc) = uVar16;
  return __ptr;
}

Assistant:

cram_block_slice_hdr *cram_decode_slice_header(cram_fd *fd, cram_block *b) {
    cram_block_slice_hdr *hdr;
    char *cp = (char *)b->data;
    int i;

    if (b->content_type != MAPPED_SLICE &&
	b->content_type != UNMAPPED_SLICE)
	return NULL;

    if (!(hdr  = calloc(1, sizeof(*hdr))))
	return NULL;

    hdr->content_type = b->content_type;

    if (b->content_type == MAPPED_SLICE) {
	cp += itf8_get(cp, &hdr->ref_seq_id);
	cp += itf8_get(cp, &hdr->ref_seq_start);
	cp += itf8_get(cp, &hdr->ref_seq_span);
    }
    cp += itf8_get(cp, &hdr->num_records);
    hdr->record_counter = 0;
    if (CRAM_MAJOR_VERS(fd->version) == 2) {
	int32_t i32;
	cp += itf8_get(cp, &i32);
	hdr->record_counter = i32;
    } else if (CRAM_MAJOR_VERS(fd->version) >= 3) {
	cp += ltf8_get(cp, &hdr->record_counter);
    }

    cp += itf8_get(cp, &hdr->num_blocks);

    cp += itf8_get(cp, &hdr->num_content_ids);
    hdr->block_content_ids = malloc(hdr->num_content_ids * sizeof(int32_t));
    if (!hdr->block_content_ids) {
	free(hdr);
	return NULL;
    }

    for (i = 0; i < hdr->num_content_ids; i++) {
	cp += itf8_get(cp, &hdr->block_content_ids[i]);
    }

    if (b->content_type == MAPPED_SLICE) {
	cp += itf8_get(cp, &hdr->ref_base_id);
    }

    if (CRAM_MAJOR_VERS(fd->version) != 1) {
	memcpy(hdr->md5, cp, 16);
    } else {
	memset(hdr->md5, 0, 16);
    }

    return hdr;
}